

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_file_types.cpp
# Opt level: O2

char * crnlib::get_texture_type_desc(texture_type t)

{
  if (t < cNumTextureTypes) {
    return &DAT_00194c14 + *(int *)(&DAT_00194c14 + (ulong)t * 4);
  }
  return "?";
}

Assistant:

const char* get_texture_type_desc(texture_type t) {
  switch (t) {
    case cTextureTypeUnknown:
      return "Unknown";
    case cTextureTypeRegularMap:
      return "2D map";
    case cTextureTypeNormalMap:
      return "Normal map";
    case cTextureTypeVerticalCrossCubemap:
      return "Vertical Cross Cubemap";
    case cTextureTypeCubemap:
      return "Cubemap";
    default:
      break;
  }

  CRNLIB_ASSERT(false);

  return "?";
}